

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieCec.c
# Opt level: O0

Gia_Man_t * Abc_NtkDeriveFlatGia(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Gia_Man_t *p;
  char *pcVar2;
  Abc_Obj_t *pAVar3;
  Gia_Man_t *pGVar4;
  int local_2c;
  int i;
  Abc_Obj_t *pTerm;
  Gia_Man_t *pGia;
  Gia_Man_t *pTemp;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsNetlist(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieCec.c"
                  ,0x109,"Gia_Man_t *Abc_NtkDeriveFlatGia(Abc_Ntk_t *)");
  }
  iVar1 = Abc_NtkLatchNum(pNtk);
  if (iVar1 != 0) {
    __assert_fail("!Abc_NtkLatchNum(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieCec.c"
                  ,0x10a,"Gia_Man_t *Abc_NtkDeriveFlatGia(Abc_Ntk_t *)");
  }
  Abc_NtkFillTemp(pNtk);
  p = Gia_ManStart(0x10000);
  pcVar2 = Abc_NtkName(pNtk);
  pcVar2 = Abc_UtilStrsav(pcVar2);
  p->pName = pcVar2;
  pcVar2 = Abc_NtkSpec(pNtk);
  pcVar2 = Abc_UtilStrsav(pcVar2);
  p->pSpec = pcVar2;
  Gia_ManHashAlloc(p);
  for (local_2c = 0; iVar1 = Abc_NtkPiNum(pNtk), local_2c < iVar1; local_2c = local_2c + 1) {
    pAVar3 = Abc_NtkPi(pNtk,local_2c);
    iVar1 = Gia_ManAppendCi(p);
    pAVar3 = Abc_ObjFanout0(pAVar3);
    (pAVar3->field_6).iTemp = iVar1;
  }
  Abc_NtkDeriveFlatGia_rec(p,pNtk);
  for (local_2c = 0; iVar1 = Abc_NtkPoNum(pNtk), local_2c < iVar1; local_2c = local_2c + 1) {
    pAVar3 = Abc_NtkPo(pNtk,local_2c);
    pAVar3 = Abc_ObjFanin0(pAVar3);
    Gia_ManAppendCo(p,(pAVar3->field_6).iTemp);
  }
  Gia_ManHashStop(p);
  Gia_ManSetRegNum(p,0);
  pGVar4 = Gia_ManCleanup(p);
  Gia_ManStop(p);
  return pGVar4;
}

Assistant:

Gia_Man_t * Abc_NtkDeriveFlatGia( Abc_Ntk_t * pNtk )
{
    Gia_Man_t * pTemp, * pGia = NULL;
    Abc_Obj_t * pTerm;
    int i;

    assert( Abc_NtkIsNetlist(pNtk) );
    assert( !Abc_NtkLatchNum(pNtk) );
    Abc_NtkFillTemp( pNtk );
    // start the network
    pGia = Gia_ManStart( (1<<16) );
    pGia->pName = Abc_UtilStrsav( Abc_NtkName(pNtk) );
    pGia->pSpec = Abc_UtilStrsav( Abc_NtkSpec(pNtk) );
    Gia_ManHashAlloc( pGia );
    // create PIs
    Abc_NtkForEachPi( pNtk, pTerm, i )
        Abc_ObjFanout0(pTerm)->iTemp = Gia_ManAppendCi( pGia );
    // recursively flatten hierarchy
    Abc_NtkDeriveFlatGia_rec( pGia, pNtk );
    // create POs
    Abc_NtkForEachPo( pNtk, pTerm, i )
        Gia_ManAppendCo( pGia, Abc_ObjFanin0(pTerm)->iTemp );
    // prepare return value
    Gia_ManHashStop( pGia );
    Gia_ManSetRegNum( pGia, 0 );
    pGia = Gia_ManCleanup( pTemp = pGia );
    Gia_ManStop( pTemp );
    return pGia;
}